

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall jhu::thrax::PhraseTests_HasValue_Test::TestBody(PhraseTests_HasValue_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_b8 [4];
  Span s;
  AssertHelper local_98;
  Message local_90;
  SpanPair local_82;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48;
  Message local_40 [3];
  Span local_26;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  PhraseTests_HasValue_Test *this_local;
  
  local_26.start = 0;
  local_26.end = 0;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_21 = Span::empty(&local_26);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"Span{}.empty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_82.src.start = 0;
  local_82.src.end = 0;
  local_82.tgt.start = 0;
  local_82.tgt.end = 0;
  local_79 = SpanPair::empty(&local_82);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_78,(AssertionResult *)"SpanPair{}.empty()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  gtest_ar__2.message_.ptr_._4_2_ = 1;
  gtest_ar__2.message_.ptr_._6_2_ = 1;
  local_d1 = Span::empty((Span *)((long)&gtest_ar__2.message_.ptr_ + 4));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)"s.empty()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  gtest_ar__2.message_.ptr_._6_2_ = gtest_ar__2.message_.ptr_._6_2_ + 1;
  local_119 = Span::empty((Span *)((long)&gtest_ar__2.message_.ptr_ + 4));
  local_119 = !local_119;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)local_118,(AssertionResult *)"s.empty()","true","false",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  return;
}

Assistant:

TEST(PhraseTests, HasValue) {
  EXPECT_TRUE(Span{}.empty());
  EXPECT_TRUE(SpanPair{}.empty());
  Span s{1, 1};
  EXPECT_TRUE(s.empty());
  s.end++;
  EXPECT_FALSE(s.empty());
}